

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

char * INT_create_router_action_spec(FMStructDescList format_list,char *function)

{
  void *ptr;
  char *__s;
  size_t sVar1;
  char *in_RSI;
  FMStructDescRec *in_RDI;
  bool bVar2;
  char *unaff_retaddr;
  char *str;
  int i;
  int format_count;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  char *local_20;
  int local_18;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    bVar2 = false;
    if (in_RDI != (FMStructDescRec *)0x0) {
      bVar2 = in_RDI[(int)local_14].format_name != (char *)0x0;
    }
    if (!bVar2) break;
    local_14 = local_14 + 1;
  }
  local_20 = (char *)INT_CMmalloc(in_stack_ffffffffffffffc0);
  sprintf(local_20,"Router Action   Format Count %d\n",(ulong)local_14);
  for (local_18 = 0; local_18 < (int)local_14; local_18 = local_18 + 1) {
    local_20 = add_FMfieldlist_to_string(unaff_retaddr,in_RDI);
  }
  ptr = (void *)strlen(local_20);
  strlen(in_RSI);
  __s = (char *)INT_CMrealloc(ptr,in_stack_ffffffffffffffb8);
  sVar1 = strlen(__s);
  strcpy(__s + sVar1,in_RSI);
  return __s;
}

Assistant:

char *
INT_create_router_action_spec(FMStructDescList format_list, char *function)
{
    int format_count = 0;
    int i;
    char *str;
    while(format_list && (format_list[format_count].format_name != NULL)) format_count++;
    str = malloc(50);
    sprintf(str, "Router Action   Format Count %d\n", format_count);

    for (i = 0 ; i < format_count; i++) {
	str = add_FMfieldlist_to_string(str, &format_list[i]);
    }
    str = realloc(str, strlen(str) + strlen(function) + 1);
    strcpy(&str[strlen(str)], function);
    return str;
}